

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_TEXCRD(Context_conflict2 *ctx)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar2 = ctx->minor_ver;
  }
  if (((uint)bVar2 | (uint)ctx->major_ver << 0x10) < 0x10004) {
    parse_destination_token(ctx);
    return 2;
  }
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = parse_source_token_maybe_relative(ctx,1);
  return iVar1 + 2;
}

Assistant:

static int parse_args_TEXCRD(Context *ctx)
{
    // added extra register in ps_1_4.
    if (shader_version_atleast(ctx, 1, 4))
        return parse_args_DS(ctx);
    return parse_args_D(ctx);
}